

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseState>::BasicResult<void>
          (BasicResult<Catch::clara::detail::ParseState> *this,BasicResult<void> *other)

{
  BasicResult<void> *in_RSI;
  BasicResult<void> *in_RDI;
  ResultValueBase<Catch::clara::detail::ParseState> *in_stack_ffffffffffffffe0;
  
  detail::BasicResult<void>::type(in_RSI);
  ResultValueBase<Catch::clara::detail::ParseState>::ResultValueBase
            (in_stack_ffffffffffffffe0,(Type)((ulong)in_RDI >> 0x20));
  (in_RDI->super_ResultValueBase<void>).super_ResultBase._vptr_ResultBase =
       (_func_int **)&PTR__BasicResult_00371ea0;
  detail::BasicResult<void>::errorMessage_abi_cxx11_(in_RDI);
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }